

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker_kernel_1.cpp
# Opt level: O2

int __thiscall dlib::linker::link(linker *this,char *__from,char *__to)

{
  mutex *pmVar1;
  mutex *__mutex;
  pthread_mutex_t *ppVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ssize_t sVar6;
  ostream *poVar7;
  fatal_error *this_00;
  thread_error *this_01;
  socket_error *this_02;
  size_t in_RCX;
  int __how;
  int __how_00;
  int extraout_EDX;
  int __how_01;
  int __how_02;
  int __how_03;
  int __how_04;
  byte bVar8;
  int __fd;
  linker *plVar9;
  allocator local_1e9;
  connection **local_1e8;
  pthread_mutex_t *local_1e0;
  pthread_mutex_t *local_1d8;
  pthread_mutex_t *local_1d0;
  string local_1c8;
  char buf [200];
  char *__stat_loc;
  
  bVar3 = is_running(this);
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
    poVar7 = std::operator<<((ostream *)buf,"\n\nError detected at line ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x6e);
    std::operator<<(poVar7,".\n");
    poVar7 = std::operator<<((ostream *)buf,"Error detected in file ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/linker/linker_kernel_1.cpp"
                            );
    std::operator<<(poVar7,".\n");
    poVar7 = std::operator<<((ostream *)buf,"Error detected in function ");
    poVar7 = std::operator<<(poVar7,"void dlib::linker::link(connection &, connection &)");
    std::operator<<(poVar7,".\n\n");
    poVar7 = std::operator<<((ostream *)buf,"Failing expression was ");
    poVar7 = std::operator<<(poVar7,"this->is_running() == false");
    std::operator<<(poVar7,".\n");
    *(uint *)(buf + *(long *)(buf._0_8_ + -0x18) + 0x18) =
         *(uint *)(buf + *(long *)(buf._0_8_ + -0x18) + 0x18) | 1;
    poVar7 = std::operator<<((ostream *)buf,"\tvoid linker::link");
    poVar7 = std::operator<<(poVar7,"\n\tis_running() == ");
    is_running(this);
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    poVar7 = std::operator<<(poVar7,"\n\tthis: ");
    poVar7 = std::ostream::_M_insert<void_const*>(poVar7);
    std::operator<<(poVar7,"\n");
    this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1c8);
    __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
  }
  pmVar1 = &this->running_mutex;
  pthread_mutex_lock((pthread_mutex_t *)pmVar1);
  this->running = true;
  local_1d8 = (pthread_mutex_t *)pmVar1;
  pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
  pmVar1 = &this->cons_mutex;
  pthread_mutex_lock((pthread_mutex_t *)pmVar1);
  local_1e8 = &this->A;
  this->A = (connection *)__from;
  this->B = (connection *)__to;
  local_1e0 = (pthread_mutex_t *)pmVar1;
  pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
  pmVar1 = &this->service_connection_running_mutex;
  pthread_mutex_lock((pthread_mutex_t *)pmVar1);
  this->service_connection_running = true;
  pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
  __mutex = &this->service_connection_error_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  this->service_connection_error = false;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  plVar9 = this;
  bVar3 = create_new_thread(service_connection,this);
  iVar5 = (int)plVar9;
  if (!bVar3) {
    connection::shutdown((connection *)__from,iVar5,__how);
    connection::shutdown((connection *)__to,iVar5,__how_04);
    pthread_mutex_lock((pthread_mutex_t *)pmVar1);
    this->service_connection_running = false;
    pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
    ppVar2 = local_1e0;
    pthread_mutex_lock(local_1e0);
    *local_1e8 = (connection *)0x0;
    local_1e8[1] = (connection *)0x0;
    pthread_mutex_unlock(ppVar2);
    ppVar2 = local_1d8;
    pthread_mutex_lock(local_1d8);
    this->running = false;
    pthread_mutex_unlock(ppVar2);
    this_01 = (thread_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)buf,"failed to make new thread in linker::link()",(allocator *)&local_1c8);
    thread_error::thread_error(this_01,ECREATE_THREAD,(string *)buf);
    __cxa_throw(this_01,&thread_error::typeinfo,error::~error);
  }
  local_1d0 = (pthread_mutex_t *)__mutex;
  do {
    __fd = (int)buf;
    __stat_loc = buf;
    sVar6 = connection::read((connection *)__from,__fd,(void *)0xc8,in_RCX);
    uVar4 = (uint)sVar6;
    iVar5 = __how_00;
    if (uVar4 == 0xfffffffd) {
LAB_00261ce0:
      connection::shutdown((connection *)__from,(int)__stat_loc,iVar5);
      connection::shutdown((connection *)__to,(int)__stat_loc,__how_01);
      bVar8 = 1;
      goto LAB_00261d0b;
    }
    if (uVar4 == 0xfffffffc) {
      connection::shutdown((connection *)__to,(int)__stat_loc,__how_00);
      break;
    }
    if ((int)uVar4 < 1) {
      if (uVar4 == 0) {
        connection::shutdown_outgoing((connection *)__to);
      }
      break;
    }
    __stat_loc = buf;
    sVar6 = connection::write((connection *)__to,__fd,(void *)(ulong)(uVar4 & 0x7fffffff),in_RCX);
    iVar5 = extraout_EDX;
    if ((int)sVar6 == -3) goto LAB_00261ce0;
  } while (0 < (int)sVar6);
  bVar8 = 0;
LAB_00261d0b:
  pthread_mutex_lock((pthread_mutex_t *)pmVar1);
  while (this->service_connection_running == true) {
    signaler::wait(&this->service_connection_running_signaler,__stat_loc);
  }
  pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
  iVar5 = (int)__stat_loc;
  connection::shutdown((connection *)__from,iVar5,__how_02);
  connection::shutdown((connection *)__to,iVar5,__how_03);
  ppVar2 = local_1e0;
  pthread_mutex_lock(local_1e0);
  *local_1e8 = (connection *)0x0;
  local_1e8[1] = (connection *)0x0;
  pthread_mutex_unlock(ppVar2);
  ppVar2 = local_1d0;
  pthread_mutex_lock(local_1d0);
  bVar3 = this->service_connection_error;
  pthread_mutex_unlock(ppVar2);
  ppVar2 = local_1d8;
  pthread_mutex_lock(local_1d8);
  this->running = false;
  pthread_cond_broadcast((pthread_cond_t *)&(this->running_signaler).cond);
  iVar5 = pthread_mutex_unlock(ppVar2);
  if ((bVar8 | bVar3) == 1) {
    this_02 = (socket_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1c8,"a connection returned an error in linker::link()",&local_1e9);
    socket_error::socket_error(this_02,ECONNECTION,&local_1c8);
    __cxa_throw(this_02,&socket_error::typeinfo,error::~error);
  }
  return iVar5;
}

Assistant:

void linker::
    link (
        connection& a,
        connection& b
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( 
            this->is_running() == false ,
            "\tvoid linker::link"
            << "\n\tis_running() == " << this->is_running() 
            << "\n\tthis: " << this
            );

        running_mutex.lock();
        running = true;
        running_mutex.unlock();

        cons_mutex.lock();
        A = &a;
        B = &b;
        cons_mutex.unlock();

        

        service_connection_running_mutex.lock();
        service_connection_running = true;
        service_connection_running_mutex.unlock();

        service_connection_error_mutex.lock();
        service_connection_error = false;
        service_connection_error_mutex.unlock();

        // if we fail to make the thread
        if (!create_new_thread(service_connection,this))
        {
            a.shutdown();
            b.shutdown();

            service_connection_running_mutex.lock();
            service_connection_running = false;
            service_connection_running_mutex.unlock();

            cons_mutex.lock();
            A = 0;
            B = 0;
            cons_mutex.unlock();  

            running_mutex.lock();
            running = false;
            running_mutex.unlock();



            throw dlib::thread_error (
                ECREATE_THREAD,
                "failed to make new thread in linker::link()"
                );
        }



        // forward data from a to b
        char buf[200];
        int status;
        bool error = false; // becomes true if one of the connections returns an error
        while (true)
        {
            status = a.read(buf,sizeof(buf));
            // if there was an error reading from the socket
            if (status == OTHER_ERROR)
            {
                error = true;
                break;
            }
            else if (status == SHUTDOWN)
            {
                b.shutdown();
            }

            if (status <= 0)
            {
                // if a has closed normally
                if (status == 0)
                    b.shutdown_outgoing();
                break;            
            }

            status = b.write(buf,status);
            // if there was an error writing to the socket then break
            if (status == OTHER_ERROR)
            {
                error = true;
                break;
            }
            
            if (status <= 0)
                break;            
        }


        // if there was an error then shutdown both connections
        if (error)
        {
            a.shutdown();
            b.shutdown();
        }




        // wait for the other thread to end
        service_connection_running_mutex.lock();
        while(service_connection_running)
        {
            service_connection_running_signaler.wait();
        }
        service_connection_running_mutex.unlock();


        // make sure connections are shutdown
        a.shutdown();
        b.shutdown();


        // both threads have ended so the connections are no longer needed
        cons_mutex.lock();
        A = 0;
        B = 0;
        cons_mutex.unlock();


        // if service_connection terminated due to an error then set error to true
        service_connection_error_mutex.lock();
        if (service_connection_error)
            error = true;
        service_connection_error_mutex.unlock();


        // if we are ending because of an error
        if (error)
        {

            // signal that the link() function is ending
            running_mutex.lock();
            running = false;
            running_signaler.broadcast();
            running_mutex.unlock();

            // throw the exception for this error
            throw dlib::socket_error (
                ECONNECTION,
                "a connection returned an error in linker::link()"
                );
         
        }

        // signal that the link() function is ending
        running_mutex.lock();
        running = false;
        running_signaler.broadcast();
        running_mutex.unlock();
    }